

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locid.cpp
# Opt level: O2

void __thiscall
icu_63::Locale::Locale
          (Locale *this,char *newLanguage,char *newCountry,char *newVariant,char *newKeywords)

{
  ulong uVar1;
  char *pcVar2;
  uint uVar3;
  uint uVar4;
  size_t sVar5;
  CharString *this_00;
  char *pcVar6;
  char c;
  ulong uVar7;
  uint uVar8;
  char *pcVar9;
  bool bVar10;
  UErrorCode status;
  StringPiece local_90;
  StringPiece local_80;
  CharString togo;
  
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__Locale_00247480;
  this->fullName = this->fullNameBuffer;
  this->baseName = (char *)0x0;
  if ((newLanguage == (char *)0x0 && newCountry == (char *)0x0) && newVariant == (char *)0x0) {
    init(this,(EVP_PKEY_CTX *)0x0);
    return;
  }
  status = U_ZERO_ERROR;
  if (newLanguage == (char *)0x0) {
    uVar4 = 0;
  }
  else {
    sVar5 = strlen(newLanguage);
    uVar4 = (uint)sVar5;
    if (0x15555555 < uVar4) {
      setToBogus(this);
      return;
    }
  }
  CharString::CharString(&togo,newLanguage,uVar4,&status);
  uVar4 = 0;
  uVar8 = 0;
  if (newCountry == (char *)0x0) {
LAB_0019c0cd:
    if (newVariant == (char *)0x0) {
      pcVar6 = (char *)0x0;
    }
    else {
      pcVar6 = newVariant + -1;
      do {
        pcVar9 = pcVar6;
        pcVar6 = pcVar9 + 1;
      } while (pcVar9[1] == '_');
      sVar5 = strlen(pcVar6);
      uVar3 = (uint)sVar5;
      if (0x15555555 < uVar3) goto LAB_0019c225;
      uVar4 = (uint)(uVar3 != 0);
      uVar7 = (ulong)(uVar3 & 0x1fffffff);
      do {
        if ((long)uVar7 < 2) goto LAB_0019c123;
        uVar1 = uVar7 - 1;
        pcVar2 = pcVar9 + uVar7;
        uVar7 = uVar1;
      } while (*pcVar2 == '_');
      uVar4 = (int)uVar1 + 1;
    }
LAB_0019c123:
    if (newKeywords == (char *)0x0) {
      bVar10 = true;
    }
    else {
      sVar5 = strlen(newKeywords);
      if (0x15555555 < (uint)sVar5) goto LAB_0019c225;
      bVar10 = (uint)sVar5 == 0;
    }
    if (uVar4 != 0 || uVar8 != 0) {
      CharString::append(&togo,'_',&status);
    }
    if (uVar8 != 0) {
      StringPiece::StringPiece(&local_80,newCountry);
      CharString::append(&togo,local_80.ptr_,local_80.length_,&status);
    }
    if (uVar4 != 0) {
      this_00 = CharString::append(&togo,'_',&status);
      CharString::append(this_00,pcVar6,uVar4,&status);
    }
    if (!bVar10) {
      pcVar6 = strchr(newKeywords,0x3d);
      c = '@';
      if (pcVar6 == (char *)0x0) {
        CharString::append(&togo,'_',&status);
        if (uVar4 == 0) {
          c = '_';
          goto LAB_0019c1ce;
        }
      }
      else {
LAB_0019c1ce:
        CharString::append(&togo,c,&status);
      }
      StringPiece::StringPiece(&local_90,newKeywords);
      CharString::append(&togo,local_90.ptr_,local_90.length_,&status);
    }
    if (status < U_ILLEGAL_ARGUMENT_ERROR) {
      init(this,(EVP_PKEY_CTX *)togo.buffer.ptr);
      goto LAB_0019c22d;
    }
  }
  else {
    sVar5 = strlen(newCountry);
    uVar8 = (uint)sVar5;
    if (uVar8 < 0x15555556) goto LAB_0019c0cd;
  }
LAB_0019c225:
  setToBogus(this);
LAB_0019c22d:
  MaybeStackArray<char,_40>::~MaybeStackArray(&togo.buffer);
  return;
}

Assistant:

Locale::Locale( const   char * newLanguage,
                const   char * newCountry,
                const   char * newVariant,
                const   char * newKeywords)
    : UObject(), fullName(fullNameBuffer), baseName(NULL)
{
    if( (newLanguage==NULL) && (newCountry == NULL) && (newVariant == NULL) )
    {
        init(NULL, FALSE); /* shortcut */
    }
    else
    {
        UErrorCode status = U_ZERO_ERROR;
        int32_t size = 0;
        int32_t lsize = 0;
        int32_t csize = 0;
        int32_t vsize = 0;
        int32_t ksize = 0;

        // Calculate the size of the resulting string.

        // Language
        if ( newLanguage != NULL )
        {
            lsize = (int32_t)uprv_strlen(newLanguage);
            if ( lsize < 0 || lsize > ULOC_STRING_LIMIT ) { // int32 wrap
                setToBogus();
                return;
            }
            size = lsize;
        }

        CharString togo(newLanguage, lsize, status); // start with newLanguage

        // _Country
        if ( newCountry != NULL )
        {
            csize = (int32_t)uprv_strlen(newCountry);
            if ( csize < 0 || csize > ULOC_STRING_LIMIT ) { // int32 wrap
                setToBogus();
                return;
            }
            size += csize;
        }

        // _Variant
        if ( newVariant != NULL )
        {
            // remove leading _'s
            while(newVariant[0] == SEP_CHAR)
            {
                newVariant++;
            }

            // remove trailing _'s
            vsize = (int32_t)uprv_strlen(newVariant);
            if ( vsize < 0 || vsize > ULOC_STRING_LIMIT ) { // int32 wrap
                setToBogus();
                return;
            }
            while( (vsize>1) && (newVariant[vsize-1] == SEP_CHAR) )
            {
                vsize--;
            }
        }

        if( vsize > 0 )
        {
            size += vsize;
        }

        // Separator rules:
        if ( vsize > 0 )
        {
            size += 2;  // at least: __v
        }
        else if ( csize > 0 )
        {
            size += 1;  // at least: _v
        }

        if ( newKeywords != NULL)
        {
            ksize = (int32_t)uprv_strlen(newKeywords);
            if ( ksize < 0 || ksize > ULOC_STRING_LIMIT ) {
              setToBogus();
              return;
            }
            size += ksize + 1;
        }

        //  NOW we have the full locale string..
        // Now, copy it back.

        // newLanguage is already copied

        if ( ( vsize != 0 ) || (csize != 0) )  // at least:  __v
        {                                      //            ^
            togo.append(SEP_CHAR, status);
        }

        if ( csize != 0 )
        {
            togo.append(newCountry, status);
        }

        if ( vsize != 0)
        {
            togo.append(SEP_CHAR, status)
                .append(newVariant, vsize, status);
        }

        if ( ksize != 0)
        {
            if (uprv_strchr(newKeywords, '=')) {
                togo.append('@', status); /* keyword parsing */
            }
            else {
                togo.append('_', status); /* Variant parsing with a script */
                if ( vsize == 0) {
                    togo.append('_', status); /* No country found */
                }
            }
            togo.append(newKeywords, status);
        }

        if (U_FAILURE(status)) {
            // Something went wrong with appending, etc.
            setToBogus();
            return;
        }
        // Parse it, because for example 'language' might really be a complete
        // string.
        init(togo.data(), FALSE);
    }
}